

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void * __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::getMemory
          (CtorEvalExternalInterface *this,Address address,Name memoryName,size_t size)

{
  unsigned_long this_00;
  bool bVar1;
  pointer ppVar2;
  address64_t aVar3;
  ulong uVar4;
  size_type sVar5;
  FailToEvalException *this_01;
  reference pvVar6;
  allocator<char> local_71;
  string local_70;
  ulong local_50;
  unsigned_long max;
  vector<char,_std::allocator<char>_> *memory;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
  local_38;
  iterator it;
  size_t size_local;
  CtorEvalExternalInterface *this_local;
  Name memoryName_local;
  Address address_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  it.
  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
               )size;
  memoryName_local.super_IString.str._M_str = (char *)address.addr;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_std::vector<char,_std::allocator<char>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>_>
       ::find(&this->memories,(key_type *)&this_local);
  memory = (vector<char,_std::allocator<char>_> *)
           std::
           unordered_map<wasm::Name,_std::vector<char,_std::allocator<char>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::end(&this->memories);
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                      *)&memory);
  if (!bVar1) {
    __assert_fail("it != memories.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                  ,0x1d3,
                  "void *(anonymous namespace)::CtorEvalExternalInterface::getMemory(Address, Name, size_t)"
                 );
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_false,_true>
                         *)&local_38);
  max = (unsigned_long)&ppVar2->second;
  aVar3 = ::wasm::Address::operator_cast_to_unsigned_long
                    ((Address *)&memoryName_local.super_IString.str._M_str);
  uVar4 = aVar3 + (long)it.
                        super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                        ._M_cur;
  local_50 = uVar4;
  sVar5 = std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)max)
  ;
  if (sVar5 < uVar4) {
    if (this->MaximumMemory < local_50) {
      this_01 = (FailToEvalException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"excessively high memory address accessed",&local_71);
      FailToEvalException::FailToEvalException(this_01,&local_70);
      __cxa_throw(this_01,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)max,local_50);
  }
  this_00 = max;
  aVar3 = ::wasm::Address::operator_cast_to_unsigned_long
                    ((Address *)&memoryName_local.super_IString.str._M_str);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)this_00,aVar3);
  return pvVar6;
}

Assistant:

void* getMemory(Address address, Name memoryName, size_t size) {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    // resize the memory buffer as needed.
    auto max = address + size;
    if (max > memory.size()) {
      if (max > MaximumMemory) {
        throw FailToEvalException("excessively high memory address accessed");
      }
      memory.resize(max);
    }
    return &memory[address];
  }